

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quicly.c
# Opt level: O1

void set_address(quicly_address_t *addr,sockaddr *sa)

{
  sa_family_t sVar1;
  undefined8 uVar2;
  undefined4 uVar3;
  in_addr_t iVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  
  if (sa == (sockaddr *)0x0) {
LAB_0011f33c:
    (addr->sa).sa_family = 0;
    return;
  }
  sVar1 = sa->sa_family;
  if (sVar1 == 10) {
    uVar3._0_2_ = sa->sa_family;
    uVar3._2_1_ = sa->sa_data[0];
    uVar3._3_1_ = sa->sa_data[1];
    iVar4 = *(in_addr_t *)(sa->sa_data + 2);
    uVar5 = *(undefined4 *)(sa->sa_data + 6);
    uVar6 = *(undefined4 *)(sa->sa_data + 10);
    uVar2 = *(undefined8 *)(sa[1].sa_data + 2);
    *(undefined8 *)((addr->sa).sa_data + 10) = *(undefined8 *)(sa->sa_data + 10);
    *(undefined8 *)((long)&(addr->sin6).sin6_addr.__in6_u + 0xc) = uVar2;
  }
  else {
    if (sVar1 != 2) {
      if (sVar1 != 0) {
        ((char *)((long)addr + 2))[10] = -1;
        ((char *)((long)addr + 2))[0xb] = -1;
        ((char *)((long)addr + 2))[0xc] = -1;
        ((char *)((long)addr + 2))[0xd] = -1;
        (addr->sin6).sin6_addr.__in6_u.__u6_addr32[2] = 0xffffffff;
        (addr->sin6).sin6_addr.__in6_u.__u6_addr32[3] = 0xffffffff;
        (addr->sin6).sin6_scope_id = 0xffffffff;
        *(undefined4 *)addr = 0xffffffff;
        (addr->sin6).sin6_flowinfo = 0xffffffff;
        ((char *)((long)addr + 2))[6] = -1;
        ((char *)((long)addr + 2))[7] = -1;
        ((char *)((long)addr + 2))[8] = -1;
        ((char *)((long)addr + 2))[9] = -1;
        ((char *)((long)addr + 2))[10] = -1;
        ((char *)((long)addr + 2))[0xb] = -1;
        ((char *)((long)addr + 2))[0xc] = -1;
        ((char *)((long)addr + 2))[0xd] = -1;
        __assert_fail("!\"unexpected address type\"",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/lib/quicly.c"
                      ,0x206,"void set_address(quicly_address_t *, struct sockaddr *)");
      }
      goto LAB_0011f33c;
    }
    uVar3._0_2_ = sa->sa_family;
    uVar3._2_1_ = sa->sa_data[0];
    uVar3._3_1_ = sa->sa_data[1];
    iVar4 = *(in_addr_t *)(sa->sa_data + 2);
    uVar5 = *(undefined4 *)(sa->sa_data + 6);
    uVar6 = *(undefined4 *)(sa->sa_data + 10);
  }
  *(undefined4 *)addr = uVar3;
  (addr->sin).sin_addr.s_addr = iVar4;
  *(undefined4 *)((addr->sa).sa_data + 6) = uVar5;
  *(undefined4 *)((addr->sa).sa_data + 10) = uVar6;
  return;
}

Assistant:

static void set_address(quicly_address_t *addr, struct sockaddr *sa)
{
    if (sa == NULL) {
        addr->sa.sa_family = AF_UNSPEC;
        return;
    }

    switch (sa->sa_family) {
    case AF_UNSPEC:
        addr->sa.sa_family = AF_UNSPEC;
        break;
    case AF_INET:
        addr->sin = *(struct sockaddr_in *)sa;
        break;
    case AF_INET6:
        addr->sin6 = *(struct sockaddr_in6 *)sa;
        break;
    default:
        memset(addr, 0xff, sizeof(*addr));
        assert(!"unexpected address type");
        break;
    }
}